

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderpass.cpp
# Opt level: O1

bool RenderPassCreate(vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,string *error)

{
  pointer pRVar1;
  pointer pTVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  pointer pTVar6;
  pointer shader_program;
  string local_50;
  
  shader_program =
       (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pRVar1 = (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    bVar3 = shader_program == pRVar1;
    if (bVar3) {
      return bVar3;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "\nin vec2 position;\nvoid main() {\n    gl_Position = vec4(position, 0.0, 1.0);\n}\n"
               ,"");
    bVar4 = ShaderProgramCreate(&shader_program->Program,&shader_program->ShaderSource,&local_50,
                                error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      return bVar3;
    }
    if (shader_program->IsMain == false) {
      (*glad_glGenFramebuffers)(1,&shader_program->FBO);
      (*glad_glBindFramebuffer)(0x8d40,shader_program->FBO);
      (*glad_glGenTextures)(1,&shader_program->TextureId);
      (*glad_glBindTexture)(0xde1,shader_program->TextureId);
      if (shader_program->Width == 0) {
        __assert_fail("render_pass.Width != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x31,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (shader_program->Height == 0) {
        __assert_fail("render_pass.Height != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x32,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glTexImage2D)
                (0xde1,0,0x1908,shader_program->Width,shader_program->Height,0,0x1908,0x1401,
                 (void *)0x0);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,shader_program->TextureId,0);
      GVar5 = (*glad_glCheckFramebufferStatus)(0x8d40);
      if (GVar5 != 0x8cd5) {
        __assert_fail("glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x3d,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glBindTexture)(0xde1,0);
    }
    pTVar2 = (shader_program->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar6 = (shader_program->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1) {
      (*glad_glGenTextures)(1,&pTVar6->Id);
      (*glad_glBindTexture)(0xde1,pTVar6->Id);
      if (pTVar6->Width == 0) {
        __assert_fail("texture.Width != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x47,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (pTVar6->Height == 0) {
        __assert_fail("texture.Height != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x48,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (pTVar6->Data == (uchar *)0x0) {
        __assert_fail("texture.Data",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x49,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glTexImage2D)(0xde1,0,0x1908,pTVar6->Width,pTVar6->Height,0,0x1908,0x1401,pTVar6->Data)
      ;
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glBindTexture)(0xde1,0);
    }
    if (!bVar4) {
      return bVar3;
    }
    shader_program = shader_program + 1;
  } while( true );
}

Assistant:

bool RenderPassCreate(std::vector<RenderPass>& render_passes, std::string& error) {
    for (auto& render_pass : render_passes) {
        if (!ShaderProgramCreate(render_pass.Program, render_pass.ShaderSource, DefaultVertexShader, error)) {
            return false;
        }

        if (!render_pass.IsMain) {
            glGenFramebuffers(1, &render_pass.FBO);
            glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);

            glGenTextures(1, &render_pass.TextureId);
            glBindTexture(GL_TEXTURE_2D, render_pass.TextureId);

            assert(render_pass.Width != 0);
            assert(render_pass.Height != 0);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, render_pass.Width, render_pass.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, render_pass.TextureId, 0);

            assert(glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glBindTexture(GL_TEXTURE_2D, 0);
        }

        for (Texture& texture : render_pass.Textures) {
            glGenTextures(1, &texture.Id);
            glBindTexture(GL_TEXTURE_2D, texture.Id);

            assert(texture.Width != 0);
            assert(texture.Height != 0);
            assert(texture.Data);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture.Width, texture.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture.Data);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }

    return true;
}